

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O0

Vec_Int_t * Gia_FlaConvertToGla(Gia_Man_t *p,Vec_Int_t *vFla)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  bool bVar3;
  undefined4 local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vGla;
  Vec_Int_t *vFla_local;
  Gia_Man_t *p_local;
  
  Gia_ManIncrementTravId(p);
  pGVar2 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar2);
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar3 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCi(p,local_2c);
      bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    Gia_ObjSetTravIdCurrent(p,pGStack_28);
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar3 = false;
    if (local_2c < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pGStack_28 = Gia_ManCi(p,iVar1 + local_2c);
      bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Vec_IntEntry(vFla,local_2c);
    if (iVar1 == 0) {
      Gia_ObjSetTravIdCurrent(p,pGStack_28);
    }
    local_2c = local_2c + 1;
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStart(iVar1);
  Vec_IntWriteEntry(p_00,0,1);
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar3 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCo(p,local_2c);
      bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pGVar2 = Gia_ObjFanin0(pGStack_28);
    Gia_FlaConvertToGla_rec(p,pGVar2,p_00);
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar3 = false;
    if (local_2c < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pGStack_28 = Gia_ManCo(p,iVar1 + local_2c);
      bVar3 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Vec_IntEntry(vFla,local_2c);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjFanin0(pGStack_28);
      Gia_FlaConvertToGla_rec(p,pGVar2,p_00);
    }
    local_2c = local_2c + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_FlaConvertToGla( Gia_Man_t * p, Vec_Int_t * vFla )
{
    Vec_Int_t * vGla;
    Gia_Obj_t * pObj;
    int i;
    // mark const0 and relevant CI objects
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent(p, Gia_ManConst0(p));
    Gia_ManForEachPi( p, pObj, i )
        Gia_ObjSetTravIdCurrent(p, pObj);
    Gia_ManForEachRo( p, pObj, i )
        if ( !Vec_IntEntry(vFla, i) )
            Gia_ObjSetTravIdCurrent(p, pObj);
    // label all objects reachable from the PO and selected flops
    vGla = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_IntWriteEntry( vGla, 0, 1 );
    Gia_ManForEachPo( p, pObj, i )
        Gia_FlaConvertToGla_rec( p, Gia_ObjFanin0(pObj), vGla );
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(vFla, i) )
            Gia_FlaConvertToGla_rec( p, Gia_ObjFanin0(pObj), vGla );
    return vGla;
}